

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_map.cpp
# Opt level: O3

bool P_UseTraverse(AActor *usething,DVector2 *start,DVector2 *end,bool *foundline)

{
  AActor *thing;
  ASectorAction *pAVar1;
  double dVar2;
  bool bVar3;
  int iVar4;
  uint uVar5;
  intercept_t *in;
  line_t *plVar6;
  FPathTraverse it;
  FLineOpening open;
  DVector3 local_138;
  FSoundID local_11c;
  DVector2 local_118;
  FPathTraverse local_100;
  FLineOpening local_c0;
  
  local_100._vptr_FPathTraverse = (_func_int **)&PTR_AddLineIntercepts_00872258;
  FPathTraverse::init(&local_100,(EVP_PKEY_CTX *)0x3);
  local_138.Z = (usething->__Pos).Z;
  local_138.X = start->X;
  local_138.Y = start->Y;
LAB_00541a57:
  while( true ) {
    do {
      while( true ) {
        in = FPathTraverse::Next(&local_100);
        if (in == (intercept_t *)0x0) goto LAB_00541d37;
        if (in->isaline != false) break;
        thing = (in->d).thing;
        if ((thing != usething) &&
           (((((thing->flags5).Value & 0x2000) != 0 || (thing->special == 0x81)) &&
            (bVar3 = P_ActivateThingSpecial(thing,usething,false), bVar3)))) goto LAB_00541d37;
      }
      iVar4 = FPathTraverse::PortalRelocate(&local_100,in,3,&local_138);
    } while (iVar4 != 0);
    plVar6 = (in->d).line;
    if ((plVar6->special == 0) || ((plVar6->activation & 0x442) == 0)) break;
    if (((byte)i_compatflags2 & 8) == 0) {
      uVar5 = (uint)(1.52587890625e-05 <
                    (plVar6->delta).Y * ((plVar6->v1->p).X - local_138.X) +
                    (plVar6->delta).X * (local_138.Y - (plVar6->v1->p).Y));
    }
    else {
      uVar5 = P_VanillaPointOnLineSide(local_138.X,local_138.Y,plVar6);
    }
    plVar6 = (in->d).line;
    if (uVar5 == 1) {
      if ((plVar6->activation >> 10 & 1) == 0) break;
      P_ActivateLine(plVar6,usething,1,0x400,&local_138);
      goto LAB_00541d37;
    }
    if ((plVar6->activation & 0x442) == 0x400) break;
    P_ActivateLine(plVar6,usething,0,2,&local_138);
    uVar5 = ((in->d).line)->activation;
    if (((uint)i_compatflags >> 8 & 1) == 0) {
      if ((uVar5 & 2) != 0) goto LAB_00541d37;
    }
    else if ((uVar5 & 0x40) == 0) {
LAB_00541d37:
      FPathTraverse::~FPathTraverse(&local_100);
      return in != (intercept_t *)0x0;
    }
  }
  if ((plVar6->flags & 0x2008000) == 0) {
    local_118.X = in->frac * local_100.trace.dx + local_100.trace.x;
    local_118.Y = in->frac * local_100.trace.dy + local_100.trace.y;
    P_LineOpening(&local_c0,(AActor *)0x0,plVar6,&local_118,(DVector2 *)0x0,0);
    if ((0.0 < local_c0.range) &&
       ((((in->d).line)->special == 0 || ((i_compatflags & 0x100U) == 0)))) {
      *foundline = true;
      goto LAB_00541a57;
    }
  }
  else {
    local_c0.range = 0.0;
  }
  pAVar1 = (usething->Sector->SecActTarget).field_0.p;
  if (pAVar1 != (ASectorAction *)0x0) {
    if (((pAVar1->super_AActor).super_DThinker.super_DObject.ObjectFlags & 0x20) == 0) {
      bVar3 = ASectorAction::TriggerAction(pAVar1,usething,0x10);
      if (bVar3) goto LAB_00541d37;
    }
    else {
      (usething->Sector->SecActTarget).field_0.p = (ASectorAction *)0x0;
    }
  }
  plVar6 = (in->d).line;
  if (((byte)i_compatflags2 & 8) == 0) {
    uVar5 = (uint)(1.52587890625e-05 <
                  (plVar6->delta).Y * ((plVar6->v1->p).X - local_138.X) +
                  (plVar6->delta).X * (local_138.Y - (plVar6->v1->p).Y));
  }
  else {
    uVar5 = P_VanillaPointOnLineSide(local_138.X,local_138.Y,plVar6);
  }
  dVar2 = (&((in->d).thing)->SpriteAngle)[uVar5 != 0].Degrees;
  if ((dVar2 != 0.0) &&
     (pAVar1 = *(ASectorAction **)((long)dVar2 + 0x1e8), pAVar1 != (ASectorAction *)0x0)) {
    if (((pAVar1->super_AActor).super_DThinker.super_DObject.ObjectFlags & 0x20) == 0) {
      bVar3 = ASectorAction::TriggerAction(pAVar1,usething,0x20);
      if (bVar3) goto LAB_00541d37;
    }
    else {
      *(undefined8 *)((long)dVar2 + 0x1e8) = 0;
    }
  }
  if (usething->player != (player_t *)0x0) {
    local_11c.ID = S_FindSound("*usefail");
    S_Sound(usething,2,&local_11c,1.0,1.001);
  }
  goto LAB_00541d37;
}

Assistant:

bool P_UseTraverse(AActor *usething, const DVector2 &start, const DVector2 &end, bool &foundline)
{
	FPathTraverse it(start.X, start.Y, end.X, end.Y, PT_ADDLINES | PT_ADDTHINGS);
	intercept_t *in;
	DVector3 xpos = { start.X, start.Y, usething->Z() };

	while ((in = it.Next()))
	{
		// [RH] Check for things to talk with or use a puzzle item on
		if (!in->isaline)
		{
			if (usething == in->d.thing)
				continue;
			// Check thing

			// Check for puzzle item use or USESPECIAL flag
			// Extended to use the same activationtype mechanism as BUMPSPECIAL does
			if (in->d.thing->flags5 & MF5_USESPECIAL || in->d.thing->special == UsePuzzleItem)
			{
				if (P_ActivateThingSpecial(in->d.thing, usething))
					return true;
			}
			continue;
		}

		if (it.PortalRelocate(in, PT_ADDLINES | PT_ADDTHINGS, &xpos))
		{
			continue;
		}

		FLineOpening open;
		if (in->d.line->special == 0 || !(in->d.line->activation & (SPAC_Use | SPAC_UseThrough | SPAC_UseBack)))
		{
		blocked:
			if (in->d.line->flags & (ML_BLOCKEVERYTHING | ML_BLOCKUSE))
			{
				open.range = 0;
			}
			else
			{
				P_LineOpening(open, NULL, in->d.line, it.InterceptPoint(in));
			}
			if (open.range <= 0 ||
				(in->d.line->special != 0 && (i_compatflags & COMPATF_USEBLOCKING)))
			{
				// [RH] Give sector a chance to intercept the use

				sector_t * sec;

				sec = usething->Sector;

				if (sec->SecActTarget && sec->SecActTarget->TriggerAction(usething, SECSPAC_Use))
				{
					return true;
				}

				sec = P_PointOnLineSide(xpos, in->d.line) == 0 ?
					in->d.line->frontsector : in->d.line->backsector;

				if (sec != NULL && sec->SecActTarget &&
					sec->SecActTarget->TriggerAction(usething, SECSPAC_UseWall))
				{
					return true;
				}

				if (usething->player)
				{
					S_Sound(usething, CHAN_VOICE, "*usefail", 1, ATTN_IDLE);
				}
				return true;		// can't use through a wall
			}
			foundline = true;
			continue;			// not a special line, but keep checking
		}

		if (P_PointOnLineSide(xpos, in->d.line) == 1)
		{
			if (!(in->d.line->activation & SPAC_UseBack))
			{
				// [RH] continue traversal for two-sided lines
				//return in->d.line->backsector != NULL;		// don't use back side
				goto blocked;	// do a proper check for back sides of triggers
			}
			else
			{
				P_ActivateLine(in->d.line, usething, 1, SPAC_UseBack, &xpos);
				return true;
			}
		}
		else
		{
			if ((in->d.line->activation & (SPAC_Use | SPAC_UseThrough | SPAC_UseBack)) == SPAC_UseBack)
			{
				goto blocked; // Line cannot be used from front side so treat it as a non-trigger line
			}

			P_ActivateLine(in->d.line, usething, 0, SPAC_Use, &xpos);

			//WAS can't use more than one special line in a row
			//jff 3/21/98 NOW multiple use allowed with enabling line flag
			//[RH] And now I've changed it again. If the line is of type
			//	   SPAC_USE, then it eats the use. Everything else passes
			//	   it through, including SPAC_USETHROUGH.
			if (i_compatflags & COMPATF_USEBLOCKING)
			{
				if (in->d.line->activation & SPAC_UseThrough) continue;
				else return true;
			}
			else
			{
				if (!(in->d.line->activation & SPAC_Use)) continue;
				else return true;
			}

		}

	}
	return false;
}